

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_setfield(lua_State *L,int idx,char *k)

{
  StkId pTVar1;
  TValue *t;
  GCObject *pGVar2;
  
  t = index2addr(L,idx);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pGVar2 = (GCObject *)luaS_new(L,k);
  (pTVar1->value_).gc = pGVar2;
  pTVar1->tt_ = (pGVar2->gch).tt | 0x40;
  luaV_settable(L,t,L->top + -1,L->top + -2);
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_setfield (lua_State *L, int idx, const char *k) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  setsvalue2s(L, L->top++, luaS_new(L, k));
  luaV_settable(L, t, L->top - 1, L->top - 2);
  L->top -= 2;  /* pop value and key */
  lua_unlock(L);
}